

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O1

void __thiscall
Assimp::MD5::MD5MeshParser::MD5MeshParser(MD5MeshParser *this,SectionList *mSections)

{
  char *pcVar1;
  pointer this_00;
  FaceList *this_01;
  VertexList *this_02;
  string *psVar2;
  pointer pSVar3;
  pointer pEVar4;
  pointer pMVar5;
  pointer paVar6;
  pointer pBVar7;
  bool bVar8;
  Assimp AVar9;
  byte bVar10;
  int iVar11;
  Logger *pLVar12;
  ulong uVar13;
  byte *pbVar14;
  uint *puVar15;
  ulong uVar16;
  undefined1 uVar17;
  char cVar18;
  pointer pMVar19;
  char *pcVar20;
  uint uVar21;
  pointer pWVar22;
  Assimp *pAVar23;
  pointer c;
  Assimp *pAVar24;
  size_type sVar25;
  char *pcVar26;
  Element *elem;
  pointer pEVar27;
  pointer pSVar28;
  Element *elem_1;
  byte *pbVar29;
  long lVar30;
  undefined1 local_4e8 [48];
  vector<aiFace,_std::allocator<aiFace>_> local_4b8;
  undefined1 local_49b [955];
  undefined1 local_e0 [16];
  undefined8 local_d0;
  aiQuaternion local_c8;
  float local_b8;
  undefined8 local_b4;
  undefined8 uStack_ac;
  float local_a4;
  undefined8 local_a0;
  undefined8 uStack_98;
  float local_90;
  undefined8 local_8c;
  undefined8 uStack_84;
  undefined8 local_7c;
  undefined8 local_74;
  undefined8 uStack_6c;
  float local_64;
  undefined8 local_60;
  undefined8 uStack_58;
  float local_50;
  undefined8 local_4c;
  undefined8 uStack_44;
  float local_3c;
  
  (this->mJoints).super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mJoints).super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mMeshes).super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mJoints).super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mMeshes).super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mMeshes).super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar12 = DefaultLogger::get();
  Logger::debug(pLVar12,"MD5MeshParser begin");
  pSVar28 = (mSections->
            super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>)._M_impl
            .super__Vector_impl_data._M_start;
  pSVar3 = (mSections->
           super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pSVar28 == pSVar3) {
      pLVar12 = DefaultLogger::get();
      Logger::debug(pLVar12,"MD5MeshParser end");
      return;
    }
    psVar2 = &pSVar28->mName;
    iVar11 = std::__cxx11::string::compare((char *)psVar2);
    if (iVar11 == 0) {
      pcVar26 = (pSVar28->mGlobalValue)._M_dataplus._M_p;
      cVar18 = *pcVar26;
      if ((byte)(cVar18 - 0x3aU) < 0xf6) {
        sVar25 = 0;
      }
      else {
        uVar21 = 0;
        do {
          pcVar26 = pcVar26 + 1;
          uVar21 = (uint)(byte)(cVar18 - 0x30) + uVar21 * 10;
          cVar18 = *pcVar26;
        } while (0xf5 < (byte)(cVar18 - 0x3aU));
        sVar25 = (size_type)uVar21;
      }
      std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>::reserve
                (&this->mMeshes,sVar25);
    }
    else {
      iVar11 = std::__cxx11::string::compare((char *)psVar2);
      if (iVar11 == 0) {
        pcVar26 = (pSVar28->mGlobalValue)._M_dataplus._M_p;
        cVar18 = *pcVar26;
        if ((byte)(cVar18 - 0x3aU) < 0xf6) {
          sVar25 = 0;
        }
        else {
          uVar21 = 0;
          do {
            pcVar26 = pcVar26 + 1;
            uVar21 = (uint)(byte)(cVar18 - 0x30) + uVar21 * 10;
            cVar18 = *pcVar26;
          } while (0xf5 < (byte)(cVar18 - 0x3aU));
          sVar25 = (size_type)uVar21;
        }
        std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::reserve
                  (&this->mJoints,sVar25);
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)psVar2);
        if (iVar11 == 0) {
          pEVar4 = (pSVar28->mElements).
                   super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pEVar27 = (pSVar28->mElements).
                         super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                         ._M_impl.super__Vector_impl_data._M_start; pEVar27 != pEVar4;
              pEVar27 = pEVar27 + 1) {
            memset((BoneDesc *)local_4e8,0,0x4b4);
            memset(local_4e8 + 5,0x1b,0x3ff);
            local_e0._0_4_ = 0.0;
            local_e0._4_4_ = 0.0;
            local_e0[8] = '\0';
            local_e0[9] = '\0';
            local_e0[10] = '\0';
            local_e0[0xb] = '\0';
            local_e0[0xc] = '\0';
            local_e0[0xd] = '\0';
            local_e0[0xe] = '\0';
            local_e0[0xf] = '\0';
            local_d0._0_4_ = 0.0;
            local_d0._4_4_ = 0.0;
            local_c8.w = 1.0;
            local_c8.x = 0.0;
            local_c8.y = 0.0;
            local_c8.z = 0.0;
            local_b8 = 1.0;
            local_b4._0_4_ = 0.0;
            local_b4._4_4_ = 0.0;
            uStack_ac._0_4_ = 0.0;
            uStack_ac._4_4_ = 0.0;
            local_a4 = 1.0;
            local_a0._0_4_ = 0.0;
            local_a0._4_4_ = 0.0;
            uStack_98._0_4_ = 0.0;
            uStack_98._4_4_ = 0.0;
            local_90 = 1.0;
            local_8c._0_4_ = 0.0;
            local_8c._4_4_ = 0.0;
            uStack_84._0_4_ = 0.0;
            uStack_84._4_4_ = 0.0;
            local_7c._0_4_ = 1.0;
            local_7c._4_4_ = 1.0;
            local_74._0_4_ = 0.0;
            local_74._4_4_ = 0.0;
            uStack_6c._0_4_ = 0.0;
            uStack_6c._4_4_ = 0.0;
            local_64 = 1.0;
            local_60._0_4_ = 0.0;
            local_60._4_4_ = 0.0;
            uStack_58._0_4_ = 0.0;
            uStack_58._4_4_ = 0.0;
            local_50 = 1.0;
            local_4c._0_4_ = 0.0;
            local_4c._4_4_ = 0.0;
            uStack_44._0_4_ = 0.0;
            uStack_44._4_4_ = 0.0;
            local_3c = 1.0;
            std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
            emplace_back<Assimp::MD5::BoneDesc>(&this->mJoints,(BoneDesc *)local_4e8);
            pBVar7 = (this->mJoints).
                     super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar29 = (byte *)(pEVar27->szStart + 2);
            pcVar26 = pEVar27->szStart;
            do {
              pcVar20 = pcVar26;
              pbVar14 = pbVar29;
              pcVar26 = pcVar20 + 1;
              pbVar29 = pbVar14 + 1;
            } while (*pcVar20 != '\"');
            uVar21 = 0xffffffff;
            do {
              pbVar29 = pbVar14;
              uVar21 = uVar21 + 1;
              pcVar1 = pcVar20 + 1;
              pcVar20 = pcVar20 + 1;
              pbVar14 = pbVar29 + 1;
            } while (*pcVar1 != '\"');
            pBVar7[-1].super_BaseJointDescription.mName.length = uVar21;
            memcpy(pBVar7[-1].super_BaseJointDescription.mName.data,pcVar26,(ulong)uVar21);
            *(undefined1 *)((long)pBVar7 + ((ulong)uVar21 - 0x4b0)) = 0;
            for (; uVar13 = (ulong)*pbVar29, uVar13 < 0x21; pbVar29 = pbVar29 + 1) {
              if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar27->iLineNumber);
                }
                break;
              }
            }
            pAVar24 = (Assimp *)(pbVar29 + ((*pbVar29 - 0x2b & 0xfd) == 0));
            AVar9 = *pAVar24;
            uVar13 = 0;
            if (0xf5 < (byte)((char)AVar9 - 0x3aU)) {
              uVar13 = 0;
              do {
                uVar13 = (ulong)((uint)(byte)((char)AVar9 - 0x30) + (int)uVar13 * 10);
                AVar9 = pAVar24[1];
                pAVar24 = pAVar24 + 1;
              } while (0xf5 < (byte)((char)AVar9 - 0x3aU));
            }
            iVar11 = -(int)uVar13;
            if (*pbVar29 != 0x2d) {
              iVar11 = (int)uVar13;
            }
            pBVar7[-1].super_BaseJointDescription.mParentIndex = iVar11;
            pAVar23 = pAVar24;
            while( true ) {
              pAVar23 = pAVar23 + 1;
              uVar16 = (ulong)(byte)*pAVar24;
              if (0x20 < uVar16) break;
              if ((0x100000200U >> (uVar16 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar16 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar27->iLineNumber);
                }
                break;
              }
              pAVar24 = pAVar24 + 1;
            }
            if (*pAVar24 != (Assimp)0x28) {
              MD5Parser::ReportWarning("Unexpected token: ( was expected",pEVar27->iLineNumber);
            }
            for (; uVar16 = (ulong)(byte)*pAVar23, uVar16 < 0x21; pAVar23 = pAVar23 + 1) {
              if ((0x100000200U >> (uVar16 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar16 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar27->iLineNumber);
                }
                break;
              }
            }
            for (pAVar24 = (Assimp *)
                           fast_atoreal_move<float>
                                     (pAVar23,(char *)&pBVar7[-1].mPositionXYZ,(float *)0x1,
                                      SUB81(uVar13,0)); uVar16 = (ulong)(byte)*pAVar24,
                uVar16 < 0x21; pAVar24 = pAVar24 + 1) {
              if ((0x100000200U >> (uVar16 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar16 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar27->iLineNumber);
                }
                break;
              }
            }
            for (pAVar24 = (Assimp *)
                           fast_atoreal_move<float>
                                     (pAVar24,(char *)&pBVar7[-1].mPositionXYZ.y,(float *)0x1,
                                      SUB81(uVar13,0)); uVar16 = (ulong)(byte)*pAVar24,
                uVar16 < 0x21; pAVar24 = pAVar24 + 1) {
              if ((0x100000200U >> (uVar16 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar16 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar27->iLineNumber);
                }
                break;
              }
            }
            pbVar29 = (byte *)fast_atoreal_move<float>
                                        (pAVar24,(char *)&pBVar7[-1].mPositionXYZ.z,(float *)0x1,
                                         SUB81(uVar13,0));
            pAVar24 = (Assimp *)(pbVar29 + 2);
            for (; uVar16 = (ulong)*pbVar29, uVar16 < 0x21; pbVar29 = pbVar29 + 1) {
              if ((0x100000200U >> (uVar16 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar16 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar27->iLineNumber);
                }
                break;
              }
              pAVar24 = pAVar24 + 1;
            }
            if (*pbVar29 != 0x29) {
              MD5Parser::ReportWarning("Unexpected token: ) was expected",pEVar27->iLineNumber);
            }
            for (; uVar16 = (ulong)(byte)pAVar24[-1], uVar16 < 0x21; pAVar24 = pAVar24 + 1) {
              if ((0x100000200U >> (uVar16 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar16 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar27->iLineNumber);
                }
                break;
              }
            }
            if (pAVar24[-1] != (Assimp)0x28) {
              MD5Parser::ReportWarning("Unexpected token: ( was expected",pEVar27->iLineNumber);
            }
            while( true ) {
              uVar17 = (undefined1)uVar13;
              uVar16 = (ulong)(byte)*pAVar24;
              if (0x20 < uVar16) break;
              if ((0x100000200U >> (uVar16 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar16 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar27->iLineNumber);
                }
                break;
              }
              pAVar24 = pAVar24 + 1;
            }
            for (pAVar24 = (Assimp *)
                           fast_atoreal_move<float>
                                     (pAVar24,(char *)&pBVar7[-1].mRotationQuat,(float *)0x1,
                                      (bool)uVar17); uVar13 = (ulong)(byte)*pAVar24, uVar13 < 0x21;
                pAVar24 = pAVar24 + 1) {
              if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar27->iLineNumber);
                }
                break;
              }
            }
            for (pAVar24 = (Assimp *)
                           fast_atoreal_move<float>
                                     (pAVar24,(char *)&pBVar7[-1].mRotationQuat.y,(float *)0x1,
                                      (bool)uVar17); uVar13 = (ulong)(byte)*pAVar24, uVar13 < 0x21;
                pAVar24 = pAVar24 + 1) {
              if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar27->iLineNumber);
                }
                break;
              }
            }
            for (pbVar29 = (byte *)fast_atoreal_move<float>
                                             (pAVar24,(char *)&pBVar7[-1].mRotationQuat.z,
                                              (float *)0x1,(bool)uVar17); uVar13 = (ulong)*pbVar29,
                uVar13 < 0x21; pbVar29 = pbVar29 + 1) {
              if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar27->iLineNumber);
                }
                break;
              }
            }
            if (*pbVar29 != 0x29) {
              MD5Parser::ReportWarning("Unexpected token: ) was expected",pEVar27->iLineNumber);
            }
          }
        }
        else {
          iVar11 = std::__cxx11::string::compare((char *)psVar2);
          if (iVar11 == 0) {
            memset((MeshDesc *)local_4e8,0,0x450);
            memset(local_49b,0x1b,0x3ff);
            std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>::
            emplace_back<Assimp::MD5::MeshDesc>(&this->mMeshes,(MeshDesc *)local_4e8);
            std::vector<aiFace,_std::allocator<aiFace>_>::~vector(&local_4b8);
            if ((pointer)local_4e8._24_8_ != (pointer)0x0) {
              operator_delete((void *)local_4e8._24_8_);
            }
            if ((pointer)local_4e8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_4e8._0_8_);
            }
            pEVar27 = (pSVar28->mElements).
                      super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pEVar4 = (pSVar28->mElements).
                     super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (pEVar27 != pEVar4) {
              pMVar5 = (this->mMeshes).
                       super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              this_00 = pMVar5 + -1;
              this_01 = &pMVar5[-1].mFaces;
              this_02 = &pMVar5[-1].mVertices;
              do {
                pAVar24 = (Assimp *)pEVar27->szStart;
                iVar11 = strncmp("shader",(char *)pAVar24,6);
                if (iVar11 == 0) {
                  AVar9 = pAVar24[6];
                  bVar8 = false;
                  if (((ulong)(byte)AVar9 < 0x21) &&
                     ((0x100003601U >> ((ulong)(byte)AVar9 & 0x3f) & 1) != 0)) {
                    pAVar23 = pAVar24 + 6;
                    pAVar24 = pAVar24 + 7;
                    if (AVar9 == (Assimp)0x0) {
                      pAVar24 = pAVar23;
                    }
                    bVar8 = true;
                  }
                }
                else {
                  bVar8 = false;
                }
                if (bVar8) {
                  for (; uVar13 = (ulong)(byte)*pAVar24, uVar13 < 0x21; pAVar24 = pAVar24 + 1) {
                    if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                      if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                        MD5Parser::ReportWarning("Unexpected end of line",pEVar27->iLineNumber);
                      }
                      break;
                    }
                  }
                  do {
                    pAVar23 = pAVar24;
                    pAVar24 = pAVar23 + 1;
                  } while (*pAVar23 != (Assimp)0x22);
                  uVar13 = 0xffffffffffffffff;
                  do {
                    lVar30 = uVar13 + 2;
                    uVar13 = uVar13 + 1;
                  } while (pAVar23[lVar30] != (Assimp)0x22);
                  pMVar5[-1].mShader.length = (ai_uint32)uVar13;
                  memcpy(pMVar5[-1].mShader.data,pAVar23 + 1,uVar13 & 0xffffffff);
                  *(undefined1 *)((long)pMVar5 + ((uVar13 & 0xffffffff) - 0x404)) = 0;
                }
                else {
                  iVar11 = strncmp("numverts",(char *)pAVar24,8);
                  if (iVar11 == 0) {
                    AVar9 = pAVar24[8];
                    bVar8 = false;
                    if (((ulong)(byte)AVar9 < 0x21) &&
                       ((0x100003601U >> ((ulong)(byte)AVar9 & 0x3f) & 1) != 0)) {
                      pAVar23 = pAVar24 + 8;
                      pAVar24 = pAVar24 + 9;
                      if (AVar9 == (Assimp)0x0) {
                        pAVar24 = pAVar23;
                      }
                      bVar8 = true;
                    }
                  }
                  else {
                    bVar8 = false;
                  }
                  pAVar23 = pAVar24;
                  if (bVar8) {
                    while( true ) {
                      pAVar23 = pAVar23 + 1;
                      uVar13 = (ulong)(byte)*pAVar24;
                      if (0x20 < uVar13) break;
                      if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar27->iLineNumber);
                        }
                        break;
                      }
                      pAVar24 = pAVar24 + 1;
                    }
                    AVar9 = *pAVar24;
                    if ((byte)((char)AVar9 - 0x3aU) < 0xf6) {
                      sVar25 = 0;
                    }
                    else {
                      uVar21 = 0;
                      do {
                        uVar21 = (uint)(byte)((char)AVar9 - 0x30) + uVar21 * 10;
                        AVar9 = *pAVar23;
                        pAVar23 = pAVar23 + 1;
                      } while (0xf5 < (byte)((char)AVar9 - 0x3aU));
                      sVar25 = (size_type)uVar21;
                    }
                    std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::
                    resize(this_02,sVar25);
                  }
                  else {
                    iVar11 = strncmp("numtris",(char *)pAVar24,7);
                    if (iVar11 == 0) {
                      AVar9 = pAVar24[7];
                      bVar8 = false;
                      if (((ulong)(byte)AVar9 < 0x21) &&
                         ((0x100003601U >> ((ulong)(byte)AVar9 & 0x3f) & 1) != 0)) {
                        pAVar23 = pAVar24 + 7;
                        pAVar24 = pAVar24 + 8;
                        if (AVar9 == (Assimp)0x0) {
                          pAVar24 = pAVar23;
                        }
                        bVar8 = true;
                      }
                    }
                    else {
                      bVar8 = false;
                    }
                    pAVar23 = pAVar24;
                    if (bVar8) {
                      while( true ) {
                        pAVar23 = pAVar23 + 1;
                        uVar13 = (ulong)(byte)*pAVar24;
                        if (0x20 < uVar13) break;
                        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar27->iLineNumber);
                          }
                          break;
                        }
                        pAVar24 = pAVar24 + 1;
                      }
                      AVar9 = *pAVar24;
                      if ((byte)((char)AVar9 - 0x3aU) < 0xf6) {
                        sVar25 = 0;
                      }
                      else {
                        uVar21 = 0;
                        do {
                          uVar21 = (uint)(byte)((char)AVar9 - 0x30) + uVar21 * 10;
                          AVar9 = *pAVar23;
                          pAVar23 = pAVar23 + 1;
                        } while (0xf5 < (byte)((char)AVar9 - 0x3aU));
                        sVar25 = (size_type)uVar21;
                      }
                      std::vector<aiFace,_std::allocator<aiFace>_>::resize(this_01,sVar25);
                    }
                    else {
                      iVar11 = strncmp("numweights",(char *)pAVar24,10);
                      if (iVar11 == 0) {
                        AVar9 = pAVar24[10];
                        bVar8 = false;
                        if (((ulong)(byte)AVar9 < 0x21) &&
                           ((0x100003601U >> ((ulong)(byte)AVar9 & 0x3f) & 1) != 0)) {
                          pAVar23 = pAVar24 + 10;
                          pAVar24 = pAVar24 + 0xb;
                          if (AVar9 == (Assimp)0x0) {
                            pAVar24 = pAVar23;
                          }
                          bVar8 = true;
                        }
                      }
                      else {
                        bVar8 = false;
                      }
                      pAVar23 = pAVar24;
                      if (bVar8) {
                        while( true ) {
                          pAVar23 = pAVar23 + 1;
                          uVar13 = (ulong)(byte)*pAVar24;
                          if (0x20 < uVar13) break;
                          if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                            if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                              MD5Parser::ReportWarning
                                        ("Unexpected end of line",pEVar27->iLineNumber);
                            }
                            break;
                          }
                          pAVar24 = pAVar24 + 1;
                        }
                        AVar9 = *pAVar24;
                        if ((byte)((char)AVar9 - 0x3aU) < 0xf6) {
                          sVar25 = 0;
                        }
                        else {
                          uVar21 = 0;
                          do {
                            uVar21 = (uint)(byte)((char)AVar9 - 0x30) + uVar21 * 10;
                            AVar9 = *pAVar23;
                            pAVar23 = pAVar23 + 1;
                          } while (0xf5 < (byte)((char)AVar9 - 0x3aU));
                          sVar25 = (size_type)uVar21;
                        }
                        std::
                        vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>::
                        resize(&this_00->mWeights,sVar25);
                      }
                      else {
                        iVar11 = strncmp("vert",(char *)pAVar24,4);
                        if (iVar11 == 0) {
                          AVar9 = pAVar24[4];
                          bVar8 = false;
                          if (((ulong)(byte)AVar9 < 0x21) &&
                             ((0x100003601U >> ((ulong)(byte)AVar9 & 0x3f) & 1) != 0)) {
                            pAVar23 = pAVar24 + 4;
                            pAVar24 = pAVar24 + 5;
                            if (AVar9 == (Assimp)0x0) {
                              pAVar24 = pAVar23;
                            }
                            bVar8 = true;
                          }
                        }
                        else {
                          bVar8 = false;
                        }
                        if (bVar8) {
                          for (; uVar13 = (ulong)(byte)*pAVar24, uVar13 < 0x21;
                              pAVar24 = pAVar24 + 1) {
                            if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                              if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                                MD5Parser::ReportWarning
                                          ("Unexpected end of line",pEVar27->iLineNumber);
                              }
                              break;
                            }
                          }
                          AVar9 = *pAVar24;
                          uVar21 = 0;
                          pAVar23 = pAVar24;
                          if (0xf5 < (byte)((char)AVar9 - 0x3aU)) {
                            uVar21 = 0;
                            do {
                              uVar21 = (uint)(byte)((char)AVar9 - 0x30) + uVar21 * 10;
                              AVar9 = pAVar24[1];
                              pAVar24 = pAVar24 + 1;
                              pAVar23 = pAVar24;
                            } while (0xf5 < (byte)((char)AVar9 - 0x3aU));
                          }
                          while( true ) {
                            pAVar23 = pAVar23 + 1;
                            uVar13 = (ulong)(byte)*pAVar24;
                            if (0x20 < uVar13) break;
                            if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                              if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                                MD5Parser::ReportWarning
                                          ("Unexpected end of line",pEVar27->iLineNumber);
                              }
                              break;
                            }
                            pAVar24 = pAVar24 + 1;
                          }
                          pMVar19 = pMVar5;
                          if ((ulong)((long)pMVar5[-1].mVertices.
                                            super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pMVar5[-1].mVertices.
                                            super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 4) <=
                              (ulong)uVar21) {
                            std::
                            vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                            ::resize(this_02,(ulong)(uVar21 + 1));
                          }
                          uVar17 = SUB81(pMVar19,0);
                          c = (this_02->
                              super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar21;
                          if (*pAVar24 != (Assimp)0x28) {
                            MD5Parser::ReportWarning
                                      ("Unexpected token: ( was expected",pEVar27->iLineNumber);
                          }
                          for (; uVar13 = (ulong)(byte)*pAVar23, uVar13 < 0x21;
                              pAVar23 = pAVar23 + 1) {
                            if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                              if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                                MD5Parser::ReportWarning
                                          ("Unexpected end of line",pEVar27->iLineNumber);
                              }
                              break;
                            }
                          }
                          for (pAVar24 = (Assimp *)
                                         fast_atoreal_move<float>
                                                   (pAVar23,(char *)c,(float *)0x1,(bool)uVar17);
                              uVar13 = (ulong)(byte)*pAVar24, uVar13 < 0x21; pAVar24 = pAVar24 + 1)
                          {
                            if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                              if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                                MD5Parser::ReportWarning
                                          ("Unexpected end of line",pEVar27->iLineNumber);
                              }
                              break;
                            }
                          }
                          pbVar14 = (byte *)fast_atoreal_move<float>
                                                      (pAVar24,(char *)&(c->mUV).y,(float *)0x1,
                                                       (bool)uVar17);
                          pbVar29 = pbVar14;
                          while( true ) {
                            pbVar29 = pbVar29 + 1;
                            uVar13 = (ulong)*pbVar14;
                            if (0x20 < uVar13) break;
                            if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                              if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                                MD5Parser::ReportWarning
                                          ("Unexpected end of line",pEVar27->iLineNumber);
                              }
                              break;
                            }
                            pbVar14 = pbVar14 + 1;
                          }
                          if (*pbVar14 != 0x29) {
                            MD5Parser::ReportWarning
                                      ("Unexpected token: ) was expected",pEVar27->iLineNumber);
                          }
                          for (; uVar13 = (ulong)*pbVar29, uVar13 < 0x21; pbVar29 = pbVar29 + 1) {
                            if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                              if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                                MD5Parser::ReportWarning
                                          ("Unexpected end of line",pEVar27->iLineNumber);
                              }
                              break;
                            }
                          }
                          bVar10 = *pbVar29;
                          uVar21 = 0;
                          if (0xf5 < (byte)(bVar10 - 0x3a)) {
                            uVar21 = 0;
                            do {
                              uVar21 = (uint)(byte)(bVar10 - 0x30) + uVar21 * 10;
                              bVar10 = pbVar29[1];
                              pbVar29 = pbVar29 + 1;
                            } while (0xf5 < (byte)(bVar10 - 0x3a));
                          }
                          c->mFirstWeight = uVar21;
                          pbVar14 = pbVar29;
                          while( true ) {
                            pbVar14 = pbVar14 + 1;
                            uVar13 = (ulong)*pbVar29;
                            if (0x20 < uVar13) break;
                            if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                              if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                                MD5Parser::ReportWarning
                                          ("Unexpected end of line",pEVar27->iLineNumber);
                              }
                              break;
                            }
                            pbVar29 = pbVar29 + 1;
                          }
                          bVar10 = *pbVar29;
                          uVar21 = 0;
                          if (0xf5 < (byte)(bVar10 - 0x3a)) {
                            uVar21 = 0;
                            do {
                              uVar21 = (uint)(byte)(bVar10 - 0x30) + uVar21 * 10;
                              bVar10 = *pbVar14;
                              pbVar14 = pbVar14 + 1;
                            } while (0xf5 < (byte)(bVar10 - 0x3a));
                          }
                          c->mNumWeights = uVar21;
                        }
                        else {
                          iVar11 = strncmp("tri",(char *)pAVar24,3);
                          if (iVar11 == 0) {
                            AVar9 = pAVar24[3];
                            bVar8 = false;
                            if (((ulong)(byte)AVar9 < 0x21) &&
                               ((0x100003601U >> ((ulong)(byte)AVar9 & 0x3f) & 1) != 0)) {
                              pAVar23 = pAVar24 + 3;
                              pAVar24 = pAVar24 + 4;
                              if (AVar9 == (Assimp)0x0) {
                                pAVar24 = pAVar23;
                              }
                              bVar8 = true;
                            }
                          }
                          else {
                            bVar8 = false;
                          }
                          if (bVar8) {
                            for (; uVar13 = (ulong)(byte)*pAVar24, uVar13 < 0x21;
                                pAVar24 = pAVar24 + 1) {
                              if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                                if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                                  MD5Parser::ReportWarning
                                            ("Unexpected end of line",pEVar27->iLineNumber);
                                }
                                break;
                              }
                            }
                            AVar9 = *pAVar24;
                            uVar21 = 0;
                            if (0xf5 < (byte)((char)AVar9 - 0x3aU)) {
                              uVar21 = 0;
                              do {
                                uVar21 = (uint)(byte)((char)AVar9 - 0x30) + uVar21 * 10;
                                AVar9 = pAVar24[1];
                                pAVar24 = pAVar24 + 1;
                              } while (0xf5 < (byte)((char)AVar9 - 0x3aU));
                            }
                            uVar13 = (ulong)uVar21;
                            if ((ulong)((long)pMVar5[-1].mFaces.
                                              super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                        (long)pMVar5[-1].mFaces.
                                              super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                              _M_impl.super__Vector_impl_data._M_start >> 4) <=
                                uVar13) {
                              std::vector<aiFace,_std::allocator<aiFace>_>::resize
                                        (this_01,(ulong)(uVar21 + 1));
                            }
                            paVar6 = (this_01->super__Vector_base<aiFace,_std::allocator<aiFace>_>).
                                     _M_impl.super__Vector_impl_data._M_start;
                            paVar6[uVar13].mNumIndices = 3;
                            puVar15 = (uint *)operator_new__(0xc);
                            paVar6[uVar13].mIndices = puVar15;
                            lVar30 = 0;
LAB_00443c26:
                            do {
                              uVar16 = (ulong)(byte)*pAVar24;
                              if (uVar16 < 0x21) {
                                if ((0x100000200U >> (uVar16 & 0x3f) & 1) != 0) {
                                  pAVar24 = pAVar24 + 1;
                                  goto LAB_00443c26;
                                }
                                if ((0x3401UL >> (uVar16 & 0x3f) & 1) != 0) {
                                  MD5Parser::ReportWarning
                                            ("Unexpected end of line",pEVar27->iLineNumber);
                                }
                              }
                              AVar9 = *pAVar24;
                              uVar21 = 0;
                              if (0xf5 < (byte)((char)AVar9 - 0x3aU)) {
                                uVar21 = 0;
                                do {
                                  uVar21 = (uint)(byte)((char)AVar9 - 0x30) + uVar21 * 10;
                                  AVar9 = pAVar24[1];
                                  pAVar24 = pAVar24 + 1;
                                } while (0xf5 < (byte)((char)AVar9 - 0x3aU));
                              }
                              paVar6[uVar13].mIndices[lVar30] = uVar21;
                              lVar30 = lVar30 + 1;
                            } while (lVar30 != 3);
                          }
                          else {
                            iVar11 = strncmp("weight",(char *)pAVar24,6);
                            if (iVar11 == 0) {
                              AVar9 = pAVar24[6];
                              bVar8 = false;
                              if (((ulong)(byte)AVar9 < 0x21) &&
                                 ((0x100003601U >> ((ulong)(byte)AVar9 & 0x3f) & 1) != 0)) {
                                pAVar23 = pAVar24 + 6;
                                pAVar24 = pAVar24 + 7;
                                if (AVar9 == (Assimp)0x0) {
                                  pAVar24 = pAVar23;
                                }
                                bVar8 = true;
                              }
                            }
                            else {
                              bVar8 = false;
                            }
                            if (bVar8) {
                              for (; uVar13 = (ulong)(byte)*pAVar24, uVar13 < 0x21;
                                  pAVar24 = pAVar24 + 1) {
                                if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                                  if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                                    MD5Parser::ReportWarning
                                              ("Unexpected end of line",pEVar27->iLineNumber);
                                  }
                                  break;
                                }
                              }
                              AVar9 = *pAVar24;
                              uVar21 = 0;
                              if (0xf5 < (byte)((char)AVar9 - 0x3aU)) {
                                uVar21 = 0;
                                do {
                                  uVar21 = (uint)(byte)((char)AVar9 - 0x30) + uVar21 * 10;
                                  AVar9 = pAVar24[1];
                                  pAVar24 = pAVar24 + 1;
                                } while (0xf5 < (byte)((char)AVar9 - 0x3aU));
                              }
                              for (; uVar13 = (ulong)(byte)*pAVar24, uVar13 < 0x21;
                                  pAVar24 = pAVar24 + 1) {
                                if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                                  if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                                    MD5Parser::ReportWarning
                                              ("Unexpected end of line",pEVar27->iLineNumber);
                                  }
                                  break;
                                }
                              }
                              uVar16 = (ulong)uVar21;
                              uVar13 = ((long)pMVar5[-1].mWeights.
                                              super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pMVar5[-1].mWeights.
                                              super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                       -0x3333333333333333;
                              if (uVar13 < uVar16 || uVar13 - uVar16 == 0) {
                                std::
                                vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                ::resize(&this_00->mWeights,(ulong)(uVar21 + 1));
                              }
                              AVar9 = *pAVar24;
                              uVar21 = 0;
                              if (0xf5 < (byte)((char)AVar9 - 0x3aU)) {
                                uVar21 = 0;
                                do {
                                  uVar21 = (uint)(byte)((char)AVar9 - 0x30) + uVar21 * 10;
                                  AVar9 = pAVar24[1];
                                  pAVar24 = pAVar24 + 1;
                                } while (0xf5 < (byte)((char)AVar9 - 0x3aU));
                              }
                              pWVar22 = (this_00->mWeights).
                                        super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar16;
                              pWVar22->mBone = uVar21;
                              for (; uVar13 = (ulong)(byte)*pAVar24, pMVar19 = this_00,
                                  uVar13 < 0x21; pAVar24 = pAVar24 + 1) {
                                if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                                  if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                                    MD5Parser::ReportWarning
                                              ("Unexpected end of line",pEVar27->iLineNumber);
                                  }
                                  break;
                                }
                              }
                              pAVar23 = (Assimp *)
                                        fast_atoreal_move<float>
                                                  (pAVar24,(char *)&pWVar22->mWeight,(float *)0x1,
                                                   SUB81(pMVar19,0));
                              pAVar24 = pAVar23;
                              while( true ) {
                                pAVar23 = pAVar23 + 1;
                                uVar13 = (ulong)(byte)*pAVar24;
                                if (0x20 < uVar13) break;
                                if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                                  if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                                    MD5Parser::ReportWarning
                                              ("Unexpected end of line",pEVar27->iLineNumber);
                                  }
                                  break;
                                }
                                pAVar24 = pAVar24 + 1;
                              }
                              if (*pAVar24 != (Assimp)0x28) {
                                MD5Parser::ReportWarning
                                          ("Unexpected token: ( was expected",pEVar27->iLineNumber);
                              }
                              while( true ) {
                                uVar17 = SUB81(pMVar19,0);
                                uVar13 = (ulong)(byte)*pAVar23;
                                if (0x20 < uVar13) break;
                                if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                                  if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                                    MD5Parser::ReportWarning
                                              ("Unexpected end of line",pEVar27->iLineNumber);
                                  }
                                  break;
                                }
                                pAVar23 = pAVar23 + 1;
                              }
                              for (pAVar24 = (Assimp *)
                                             fast_atoreal_move<float>
                                                       (pAVar23,(char *)&pWVar22->vOffsetPosition,
                                                        (float *)0x1,(bool)uVar17);
                                  uVar13 = (ulong)(byte)*pAVar24, uVar13 < 0x21;
                                  pAVar24 = pAVar24 + 1) {
                                if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                                  if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                                    MD5Parser::ReportWarning
                                              ("Unexpected end of line",pEVar27->iLineNumber);
                                  }
                                  break;
                                }
                              }
                              for (pAVar24 = (Assimp *)
                                             fast_atoreal_move<float>
                                                       (pAVar24,(char *)&(pWVar22->vOffsetPosition).
                                                                         y,(float *)0x1,(bool)uVar17
                                                       ); uVar13 = (ulong)(byte)*pAVar24,
                                  uVar13 < 0x21; pAVar24 = pAVar24 + 1) {
                                if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                                  if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                                    MD5Parser::ReportWarning
                                              ("Unexpected end of line",pEVar27->iLineNumber);
                                  }
                                  break;
                                }
                              }
                              for (pbVar29 = (byte *)fast_atoreal_move<float>
                                                               (pAVar24,(char *)&(pWVar22->
                                                                                 vOffsetPosition).z,
                                                                (float *)0x1,(bool)uVar17);
                                  uVar13 = (ulong)*pbVar29, uVar13 < 0x21; pbVar29 = pbVar29 + 1) {
                                if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
                                  if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                                    MD5Parser::ReportWarning
                                              ("Unexpected end of line",pEVar27->iLineNumber);
                                  }
                                  break;
                                }
                              }
                              if (*pbVar29 != 0x29) {
                                MD5Parser::ReportWarning
                                          ("Unexpected token: ) was expected",pEVar27->iLineNumber);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                pEVar27 = pEVar27 + 1;
              } while (pEVar27 != pEVar4);
            }
          }
        }
      }
    }
    pSVar28 = pSVar28 + 1;
  } while( true );
}

Assistant:

MD5MeshParser::MD5MeshParser(SectionList& mSections)
{
    ASSIMP_LOG_DEBUG("MD5MeshParser begin");

    // now parse all sections
    for (SectionList::const_iterator iter =  mSections.begin(), iterEnd = mSections.end();iter != iterEnd;++iter){
        if ( (*iter).mName == "numMeshes")  {
            mMeshes.reserve(::strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ( (*iter).mName == "numJoints") {
            mJoints.reserve(::strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ((*iter).mName == "joints") {
            // "origin" -1 ( -0.000000 0.016430 -0.006044 ) ( 0.707107 0.000000 0.707107 )
            for (const auto & elem : (*iter).mElements){
                mJoints.push_back(BoneDesc());
                BoneDesc& desc = mJoints.back();
				
                const char* sz = elem.szStart;
				AI_MD5_PARSE_STRING_IN_QUOTATION(desc.mName);
                AI_MD5_SKIP_SPACES();

                // negative values, at least -1, is allowed here
                desc.mParentIndex = (int)strtol10(sz,&sz);

                AI_MD5_READ_TRIPLE(desc.mPositionXYZ);
                AI_MD5_READ_TRIPLE(desc.mRotationQuat); // normalized quaternion, so w is not there
            }
        }
        else if ((*iter).mName == "mesh")   {
            mMeshes.push_back(MeshDesc());
            MeshDesc& desc = mMeshes.back();

            for (const auto & elem : (*iter).mElements){
                const char* sz = elem.szStart;

                // shader attribute
                if (TokenMatch(sz,"shader",6))  {
                    AI_MD5_SKIP_SPACES();
                    AI_MD5_PARSE_STRING_IN_QUOTATION(desc.mShader);
                }
                // numverts attribute
                else if (TokenMatch(sz,"numverts",8))   {
                    AI_MD5_SKIP_SPACES();
                    desc.mVertices.resize(strtoul10(sz));
                }
                // numtris attribute
                else if (TokenMatch(sz,"numtris",7))    {
                    AI_MD5_SKIP_SPACES();
                    desc.mFaces.resize(strtoul10(sz));
                }
                // numweights attribute
                else if (TokenMatch(sz,"numweights",10))    {
                    AI_MD5_SKIP_SPACES();
                    desc.mWeights.resize(strtoul10(sz));
                }
                // vert attribute
                // "vert 0 ( 0.394531 0.513672 ) 0 1"
                else if (TokenMatch(sz,"vert",4))   {
                    AI_MD5_SKIP_SPACES();
                    const unsigned int idx = ::strtoul10(sz,&sz);
                    AI_MD5_SKIP_SPACES();
                    if (idx >= desc.mVertices.size())
                        desc.mVertices.resize(idx+1);

                    VertexDesc& vert = desc.mVertices[idx];
                    if ('(' != *sz++)
                        MD5Parser::ReportWarning("Unexpected token: ( was expected",elem.iLineNumber);
                    AI_MD5_SKIP_SPACES();
                    sz = fast_atoreal_move<float>(sz,(float&)vert.mUV.x);
                    AI_MD5_SKIP_SPACES();
                    sz = fast_atoreal_move<float>(sz,(float&)vert.mUV.y);
                    AI_MD5_SKIP_SPACES();
                    if (')' != *sz++)
                        MD5Parser::ReportWarning("Unexpected token: ) was expected",elem.iLineNumber);
                    AI_MD5_SKIP_SPACES();
                    vert.mFirstWeight = ::strtoul10(sz,&sz);
                    AI_MD5_SKIP_SPACES();
                    vert.mNumWeights = ::strtoul10(sz,&sz);
                }
                // tri attribute
                // "tri 0 15 13 12"
                else if (TokenMatch(sz,"tri",3)) {
                    AI_MD5_SKIP_SPACES();
                    const unsigned int idx = strtoul10(sz,&sz);
                    if (idx >= desc.mFaces.size())
                        desc.mFaces.resize(idx+1);

                    aiFace& face = desc.mFaces[idx];
                    face.mIndices = new unsigned int[face.mNumIndices = 3];
                    for (unsigned int i = 0; i < 3;++i) {
                        AI_MD5_SKIP_SPACES();
                        face.mIndices[i] = strtoul10(sz,&sz);
                    }
                }
                // weight attribute
                // "weight 362 5 0.500000 ( -3.553583 11.893474 9.719339 )"
                else if (TokenMatch(sz,"weight",6)) {
                    AI_MD5_SKIP_SPACES();
                    const unsigned int idx = strtoul10(sz,&sz);
                    AI_MD5_SKIP_SPACES();
                    if (idx >= desc.mWeights.size())
                        desc.mWeights.resize(idx+1);

                    WeightDesc& weight = desc.mWeights[idx];
                    weight.mBone = strtoul10(sz,&sz);
                    AI_MD5_SKIP_SPACES();
                    sz = fast_atoreal_move<float>(sz,weight.mWeight);
                    AI_MD5_READ_TRIPLE(weight.vOffsetPosition);
                }
            }
        }
    }
    ASSIMP_LOG_DEBUG("MD5MeshParser end");
}